

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O1

BoundingBox * Assimp::IFC::GetBoundingBox(Polygon *poly)

{
  pointer pIVar1;
  IntPoint *point;
  pointer pIVar2;
  BoundingBox *in_RDI;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  pIVar2 = (poly->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (poly->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pIVar2 == pIVar1) {
    dVar8 = 10000000000.0;
    dVar5 = -10000000000.0;
    dVar3 = -10000000000.0;
    dVar6 = 10000000000.0;
  }
  else {
    dVar3 = -10000000000.0;
    dVar6 = 10000000000.0;
    dVar8 = 10000000000.0;
    dVar9 = -10000000000.0;
    do {
      dVar4 = (double)pIVar2->X / 1518500249.0;
      dVar7 = (double)pIVar2->Y / 1518500249.0;
      dVar5 = 0.0;
      if (0.0 <= dVar4) {
        dVar5 = dVar4;
      }
      dVar4 = 0.0;
      if (0.0 <= dVar7) {
        dVar4 = dVar7;
      }
      dVar7 = 1.0;
      if (dVar5 <= 1.0) {
        dVar7 = dVar5;
      }
      dVar5 = 1.0;
      if (dVar4 <= 1.0) {
        dVar5 = dVar4;
      }
      dVar4 = dVar7;
      if (dVar6 <= dVar7) {
        dVar4 = dVar6;
      }
      dVar6 = dVar4;
      dVar4 = dVar5;
      if (dVar8 <= dVar5) {
        dVar4 = dVar8;
      }
      dVar8 = dVar4;
      if (dVar7 <= dVar3) {
        dVar7 = dVar3;
      }
      dVar3 = dVar7;
      if (dVar5 <= dVar9) {
        dVar5 = dVar9;
      }
      pIVar2 = pIVar2 + 1;
      dVar9 = dVar5;
    } while (pIVar2 != pIVar1);
  }
  (in_RDI->first).x = dVar6;
  (in_RDI->first).y = dVar8;
  (in_RDI->second).x = dVar3;
  (in_RDI->second).y = dVar5;
  return in_RDI;
}

Assistant:

BoundingBox GetBoundingBox(const ClipperLib::Polygon& poly)
{
    IfcVector2 newbb_min, newbb_max;
    MinMaxChooser<IfcVector2>()(newbb_min, newbb_max);

    for(const ClipperLib::IntPoint& point : poly) {
        IfcVector2 vv = IfcVector2( from_int64(point.X), from_int64(point.Y));

        // sanity rounding
        vv = std::max(vv,IfcVector2());
        vv = std::min(vv,one_vec);

        newbb_min = std::min(newbb_min,vv);
        newbb_max = std::max(newbb_max,vv);
    }
    return BoundingBox(newbb_min, newbb_max);
}